

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_v4dwt_interleave_h
               (opj_v4dwt_t *dwt,OPJ_FLOAT32 *a,OPJ_UINT32 width,OPJ_UINT32 remaining_height)

{
  int iVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  uint uVar4;
  opj_v4_t *poVar5;
  int iVar6;
  uint uVar7;
  OPJ_UINT32 OVar8;
  opj_v4_t *poVar9;
  ulong uVar10;
  long lVar12;
  int iVar13;
  bool bVar14;
  OPJ_UINT32 *pOVar11;
  
  poVar5 = dwt->wavelet;
  iVar1 = dwt->cas;
  iVar2 = dwt->sn;
  OVar3 = dwt->win_h_x1;
  pOVar11 = &dwt->win_l_x0;
  OVar8 = dwt->win_l_x1;
  iVar13 = 0;
  lVar12 = (long)iVar1;
  do {
    poVar9 = poVar5 + lVar12;
    uVar4 = *pOVar11;
    uVar10 = (ulong)uVar4;
    if (((((width & 0xf) == 0) && (3 < remaining_height)) && (((ulong)a & 0xf) == 0)) &&
       (((ulong)poVar9 & 0xf) == 0)) {
      if (uVar4 < OVar8) {
        uVar7 = uVar4 * 8;
        lVar12 = 0;
        do {
          poVar9->f[uVar7] = a[uVar10 + lVar12];
          iVar6 = (int)lVar12;
          poVar9->f[uVar7 + 1] = a[width + uVar4 + iVar6];
          poVar9->f[uVar7 + 2] = a[width * 2 + uVar4 + iVar6];
          poVar9->f[uVar7 + 3] = a[width * 3 + uVar4 + iVar6];
          lVar12 = lVar12 + 1;
          uVar7 = uVar7 + 8;
        } while (OVar8 - uVar10 != lVar12);
      }
    }
    else if (uVar4 < OVar8) {
      uVar7 = uVar4 * 8;
      lVar12 = 0;
      do {
        poVar9->f[uVar7] = a[uVar10 + lVar12];
        if (remaining_height != 1) {
          iVar6 = (int)lVar12;
          poVar9->f[uVar7 + 1] = a[iVar6 + width + uVar4];
          if ((remaining_height != 2) &&
             (poVar9->f[uVar7 + 2] = a[iVar6 + width * 2 + uVar4], remaining_height != 3)) {
            poVar9->f[uVar7 + 3] = a[width * 3 + uVar4 + iVar6];
          }
        }
        lVar12 = lVar12 + 1;
        uVar7 = uVar7 + 8;
      } while (OVar8 - uVar10 != lVar12);
    }
    a = a + iVar2;
    bVar14 = iVar13 == 0;
    pOVar11 = &dwt->win_h_x0;
    OVar8 = OVar3;
    iVar13 = iVar13 + 1;
    lVar12 = 1 - (long)iVar1;
  } while (bVar14);
  return;
}

Assistant:

static void opj_v4dwt_interleave_h(opj_v4dwt_t* OPJ_RESTRICT dwt,
                                   OPJ_FLOAT32* OPJ_RESTRICT a,
                                   OPJ_UINT32 width,
                                   OPJ_UINT32 remaining_height)
{
    OPJ_FLOAT32* OPJ_RESTRICT bi = (OPJ_FLOAT32*)(dwt->wavelet + dwt->cas);
    OPJ_UINT32 i, k;
    OPJ_UINT32 x0 = dwt->win_l_x0;
    OPJ_UINT32 x1 = dwt->win_l_x1;

    for (k = 0; k < 2; ++k) {
        if (remaining_height >= 4 && ((OPJ_SIZE_T) a & 0x0f) == 0 &&
                ((OPJ_SIZE_T) bi & 0x0f) == 0 && (width & 0x0f) == 0) {
            /* Fast code path */
            for (i = x0; i < x1; ++i) {
                OPJ_UINT32 j = i;
                bi[i * 8    ] = a[j];
                j += width;
                bi[i * 8 + 1] = a[j];
                j += width;
                bi[i * 8 + 2] = a[j];
                j += width;
                bi[i * 8 + 3] = a[j];
            }
        } else {
            /* Slow code path */
            for (i = x0; i < x1; ++i) {
                OPJ_UINT32 j = i;
                bi[i * 8    ] = a[j];
                j += width;
                if (remaining_height == 1) {
                    continue;
                }
                bi[i * 8 + 1] = a[j];
                j += width;
                if (remaining_height == 2) {
                    continue;
                }
                bi[i * 8 + 2] = a[j];
                j += width;
                if (remaining_height == 3) {
                    continue;
                }
                bi[i * 8 + 3] = a[j]; /* This one*/
            }
        }

        bi = (OPJ_FLOAT32*)(dwt->wavelet + 1 - dwt->cas);
        a += dwt->sn;
        x0 = dwt->win_h_x0;
        x1 = dwt->win_h_x1;
    }
}